

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O3

llama_kv_cache_view *
llama_kv_cache_view_init
          (llama_kv_cache_view *__return_storage_ptr__,llama_context *ctx,int32_t n_seq_max)

{
  llama_kv_cache_unified *kv;
  
  kv = (ctx->kv_self)._M_t.
       super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>.
       _M_t.
       super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
       .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl;
  if (kv == (llama_kv_cache_unified *)0x0) {
    llama_log_internal(GGML_LOG_LEVEL_WARN,"%s: the context does not have a KV cache\n",
                       "llama_kv_cache_view_init");
    __return_storage_ptr__->max_contiguous = 0;
    __return_storage_ptr__->max_contiguous_idx = 0;
    __return_storage_ptr__->cells = (llama_kv_cache_view_cell *)0x0;
    __return_storage_ptr__->n_cells = 0;
    __return_storage_ptr__->n_seq_max = 0;
    __return_storage_ptr__->token_count = 0;
    __return_storage_ptr__->used_cells = 0;
    __return_storage_ptr__->cells_sequences = (llama_seq_id *)0x0;
  }
  else {
    llama_kv_cache_view_init(__return_storage_ptr__,&kv->super_llama_kv_cache,n_seq_max);
  }
  return __return_storage_ptr__;
}

Assistant:

llama_kv_cache_view llama_kv_cache_view_init(const llama_context * ctx, int32_t n_seq_max) {
    const auto * kv = ctx->get_kv_self();
    if (kv == nullptr) {
        LLAMA_LOG_WARN("%s: the context does not have a KV cache\n", __func__);
        return {};
    }

    return llama_kv_cache_view_init(*kv, n_seq_max);
}